

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O3

VkBool32 demo_check_layers(uint32_t check_count,char **check_names,uint32_t layer_count,
                          VkLayerProperties *layers)

{
  char *__s1;
  int iVar1;
  ulong uVar2;
  VkLayerProperties *__s2;
  ulong uVar3;
  
  if (check_count != 0) {
    uVar2 = 0;
    do {
      if (layer_count == 0) {
        uVar2 = 0;
LAB_0011037f:
        fprintf(_stderr,"Cannot find layer: %s\n",check_names[uVar2]);
        return 0;
      }
      __s1 = check_names[uVar2];
      __s2 = layers;
      uVar3 = (ulong)layer_count;
      while (iVar1 = strcmp(__s1,__s2->layerName), iVar1 != 0) {
        __s2 = __s2 + 1;
        uVar3 = uVar3 - 1;
        if (uVar3 == 0) {
          uVar2 = uVar2 & 0xffffffff;
          goto LAB_0011037f;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != check_count);
  }
  return 1;
}

Assistant:

static VkBool32 demo_check_layers(uint32_t check_count, const char **check_names,
                                  uint32_t layer_count,
                                  VkLayerProperties *layers) {
    uint32_t i, j;
    for (i = 0; i < check_count; i++) {
        VkBool32 found = 0;
        for (j = 0; j < layer_count; j++) {
            if (!strcmp(check_names[i], layers[j].layerName)) {
                found = 1;
                break;
            }
        }
        if (!found) {
            fprintf(stderr, "Cannot find layer: %s\n", check_names[i]);
            return 0;
        }
    }
    return 1;
}